

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

void opensshcert_signature_preimage(opensshcert_key *ck,BinarySink *bs)

{
  BinarySink *pBVar1;
  strbuf *sb;
  ptrlen pVar2;
  undefined1 local_68 [8];
  BinarySource src [1];
  strbuf *basepub;
  opensshcert_extra *extra;
  BinarySink *bs_local;
  opensshcert_key *ck_local;
  
  BinarySink_put_stringz(bs->binarysink_,*(char **)((long)((ck->sshk).vt)->extra + 0x30));
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf(ck->nonce);
  BinarySink_put_stringpl(pBVar1,pVar2);
  sb = strbuf_new();
  ssh_key_public_blob(ck->basekey,sb->binarysink_);
  pVar2 = ptrlen_from_strbuf(sb);
  BinarySource_INIT__((BinarySource *)local_68,pVar2);
  BinarySource_get_string((BinarySource *)src[0]._24_8_);
  BinarySink_put_data(bs->binarysink_,
                      (void *)(*(long *)src[0]._24_8_ + *(long *)(src[0]._24_8_ + 8)),
                      *(long *)(src[0]._24_8_ + 0x10) - *(long *)(src[0]._24_8_ + 8));
  strbuf_free(sb);
  BinarySink_put_uint64(bs->binarysink_,ck->serial);
  BinarySink_put_uint32(bs->binarysink_,(ulong)ck->type);
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf(ck->key_id);
  BinarySink_put_stringpl(pBVar1,pVar2);
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf(ck->valid_principals);
  BinarySink_put_stringpl(pBVar1,pVar2);
  BinarySink_put_uint64(bs->binarysink_,ck->valid_after);
  BinarySink_put_uint64(bs->binarysink_,ck->valid_before);
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf(ck->critical_options);
  BinarySink_put_stringpl(pBVar1,pVar2);
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf(ck->extensions);
  BinarySink_put_stringpl(pBVar1,pVar2);
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf(ck->reserved);
  BinarySink_put_stringpl(pBVar1,pVar2);
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf(ck->signature_key);
  BinarySink_put_stringpl(pBVar1,pVar2);
  return;
}

Assistant:

static void opensshcert_signature_preimage(opensshcert_key *ck, BinarySink *bs)
{
    const opensshcert_extra *extra = ck->sshk.vt->extra;
    put_stringz(bs, extra->cert_key_ssh_id);
    put_stringpl(bs, ptrlen_from_strbuf(ck->nonce));

    strbuf *basepub = strbuf_new();
    ssh_key_public_blob(ck->basekey, BinarySink_UPCAST(basepub));
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(basepub));
    get_string(src); /* skip initial key type string */
    put_data(bs, get_ptr(src), get_avail(src));
    strbuf_free(basepub);

    put_uint64(bs, ck->serial);
    put_uint32(bs, ck->type);
    put_stringpl(bs, ptrlen_from_strbuf(ck->key_id));
    put_stringpl(bs, ptrlen_from_strbuf(ck->valid_principals));
    put_uint64(bs, ck->valid_after);
    put_uint64(bs, ck->valid_before);
    put_stringpl(bs, ptrlen_from_strbuf(ck->critical_options));
    put_stringpl(bs, ptrlen_from_strbuf(ck->extensions));
    put_stringpl(bs, ptrlen_from_strbuf(ck->reserved));
    put_stringpl(bs, ptrlen_from_strbuf(ck->signature_key));
}